

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int xmlXPathNodeSetAdd(xmlNodeSetPtr cur,xmlNodePtr val)

{
  xmlNodePtr *ppxVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  iVar3 = -1;
  if (val != (xmlNodePtr)0x0 && cur != (xmlNodeSetPtr)0x0) {
    uVar2 = cur->nodeNr;
    uVar5 = 0;
    uVar4 = 0;
    if (0 < (int)uVar2) {
      uVar5 = (ulong)uVar2;
    }
    do {
      if (uVar5 == uVar4) {
        if ((cur->nodeMax <= (int)uVar2) && (iVar3 = xmlXPathNodeSetGrow(cur), iVar3 < 0)) {
          return -1;
        }
        if ((val->type == XML_NAMESPACE_DECL) &&
           (val = xmlXPathNodeSetDupNs((xmlNodePtr)val->_private,(xmlNsPtr)val),
           val == (xmlNodePtr)0x0)) {
          return -1;
        }
        iVar3 = cur->nodeNr;
        cur->nodeNr = iVar3 + 1;
        cur->nodeTab[iVar3] = val;
        break;
      }
      ppxVar1 = cur->nodeTab + uVar4;
      uVar4 = uVar4 + 1;
    } while (*ppxVar1 != val);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int
xmlXPathNodeSetAdd(xmlNodeSetPtr cur, xmlNodePtr val) {
    int i;

    if ((cur == NULL) || (val == NULL)) return(-1);

    /* @@ with_ns to check whether namespace nodes should be looked at @@ */
    /*
     * prevent duplicates
     */
    for (i = 0;i < cur->nodeNr;i++)
        if (cur->nodeTab[i] == val) return(0);

    /*
     * grow the nodeTab if needed
     */
    if (cur->nodeNr >= cur->nodeMax) {
        if (xmlXPathNodeSetGrow(cur) < 0)
            return(-1);
    }

    if (val->type == XML_NAMESPACE_DECL) {
	xmlNsPtr ns = (xmlNsPtr) val;
        xmlNodePtr nsNode = xmlXPathNodeSetDupNs((xmlNodePtr) ns->next, ns);

        if (nsNode == NULL)
            return(-1);
	cur->nodeTab[cur->nodeNr++] = nsNode;
    } else
	cur->nodeTab[cur->nodeNr++] = val;
    return(0);
}